

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void RAWToRGBARow_SSSE3(uint8_t *src_raw,uint8_t *dst_rgba,int width)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 *puVar4;
  undefined1 *puVar5;
  uvec8 auVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar6 = libyuv::kShuffleMaskRAWToRGBA;
  do {
    puVar4 = *(undefined1 (*) [32])src_raw;
    puVar5 = *(undefined1 (*) [32])src_raw;
    auVar3 = *(undefined1 (*) [32])src_raw;
    auVar1 = *(undefined1 (*) [16])*(undefined1 (*) [32])((long)src_raw + 0x20);
    src_raw = *(undefined1 (*) [32])((long)src_raw + 0x20) + 0x10;
    auVar10 = pshufb(SUB3216(*(undefined1 (*) [32])(puVar5 + 0x10),8),(undefined1  [16])auVar6);
    auVar9[8] = 0xff;
    auVar9._0_8_ = 0xff000000ff;
    auVar9._9_3_ = 0;
    auVar9[0xc] = 0xff;
    auVar9._13_3_ = 0;
    auVar8 = pshufb(*(undefined1 (*) [16])puVar4,(undefined1  [16])auVar6);
    *(undefined1 (*) [16])((long)dst_rgba + 0x20) = auVar10 | auVar9;
    auVar10[8] = 0xff;
    auVar10._0_8_ = 0xff000000ff;
    auVar10._9_3_ = 0;
    auVar10[0xc] = 0xff;
    auVar10._13_3_ = 0;
    auVar9 = pshufb(auVar3._12_16_,(undefined1  [16])auVar6);
    *(undefined1 (*) [16])dst_rgba = auVar8 | auVar10;
    auVar8[8] = 0xff;
    auVar8._0_8_ = 0xff000000ff;
    auVar8._9_3_ = 0;
    auVar8[0xc] = 0xff;
    auVar8._13_3_ = 0;
    auVar3._16_16_ = auVar1;
    auVar3._0_16_ = auVar1;
    auVar10 = pshufb(auVar3._4_16_,(undefined1  [16])auVar6);
    *(undefined1 (*) [16])((long)dst_rgba + 0x10) = auVar9 | auVar8;
    auVar1[8] = 0xff;
    auVar1._0_8_ = 0xff000000ff;
    auVar1._9_3_ = 0;
    auVar1[0xc] = 0xff;
    auVar1._13_3_ = 0;
    *(undefined1 (*) [16])((long)dst_rgba + 0x30) = auVar10 | auVar1;
    dst_rgba = (uint8_t *)((long)dst_rgba + 0x40);
    iVar7 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar7;
  } while (iVar7 != 0 && bVar2);
  return;
}

Assistant:

void RAWToRGBARow_SSSE3(const uint8_t* src_raw, uint8_t* dst_rgba, int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"  // 0x000000ff
      "psrld       $0x18,%%xmm5                  \n"
      "movdqa      %3,%%xmm4                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x20(%0),%%xmm3               \n"
      "lea         0x30(%0),%0                   \n"
      "movdqa      %%xmm3,%%xmm2                 \n"
      "palignr     $0x8,%%xmm1,%%xmm2            \n"
      "pshufb      %%xmm4,%%xmm2                 \n"
      "por         %%xmm5,%%xmm2                 \n"
      "palignr     $0xc,%%xmm0,%%xmm1            \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "movdqu      %%xmm2,0x20(%1)               \n"
      "por         %%xmm5,%%xmm0                 \n"
      "pshufb      %%xmm4,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "por         %%xmm5,%%xmm1                 \n"
      "palignr     $0x4,%%xmm3,%%xmm3            \n"
      "pshufb      %%xmm4,%%xmm3                 \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "por         %%xmm5,%%xmm3                 \n"
      "movdqu      %%xmm3,0x30(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_raw),              // %0
        "+r"(dst_rgba),             // %1
        "+r"(width)                 // %2
      : "m"(kShuffleMaskRAWToRGBA)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}